

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true> *rng)

{
  bool bVar1;
  basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
  *left;
  const_reference_t local_60;
  adaptor_sentinel_<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>,_ranges::adaptor_base>
  local_40;
  _result_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_&> e;
  _result_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_&> it;
  chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true> *rng_local;
  basic_ostream<char,_std::char_traits<char>_> *sout_local;
  
  std::operator<<(sout,'[');
  _begin_::fn::
  operator()<const_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>_&>
            ((_result_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_&> *)&e
             ,(fn *)&_::begin,rng);
  local_40.data_.
  super_box<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (compressed_pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::adaptor_base>
        )_end_::fn::
         operator()<const_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>_&>
                   ((fn *)&_::end,rng);
  bVar1 = operator!=<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_ranges::adaptor_sentinel<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::adaptor_base>_>
                    ((basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
                      *)&e,(adaptor_sentinel<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::adaptor_base>
                            *)&local_40);
  if (bVar1) {
    while( true ) {
      basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
      ::operator*(&local_60,
                  (basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
                   *)&e);
      operator<<(sout,&local_60);
      left = basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
             ::operator++((basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
                           *)&e);
      bVar1 = operator==<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_ranges::adaptor_sentinel<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::adaptor_base>_>
                        (left,(adaptor_sentinel<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::adaptor_base>
                               *)&local_40);
      if (bVar1) break;
      std::operator<<(sout,',');
    }
  }
  std::operator<<(sout,']');
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }